

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

FormalArgumentSymbol * __thiscall
slang::ast::MethodBuilder::addArg
          (MethodBuilder *this,string_view name,Type *type,ArgumentDirection direction,
          optional<slang::SVInt> *defaultValue)

{
  bool bVar1;
  FormalArgumentSymbol *this_00;
  Expression *expr;
  Compilation *in_RCX;
  VariableLifetime *in_RDI;
  undefined4 in_R8D;
  BumpAllocator *in_R9;
  FormalArgumentSymbol *arg;
  Type *in_stack_ffffffffffffff98;
  ValueSymbol *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  FormalArgumentSymbol *pFVar2;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_00 = BumpAllocator::
            emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime>
                      (in_R9,in_stack_ffffffffffffffc8,
                       (SourceLocation *)(ulong)in_stack_ffffffffffffffc0,(ArgumentDirection *)in_R9
                       ,in_RDI);
  ValueSymbol::setType(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Scope::addMember((Scope *)in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->super_Symbol);
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
            ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)in_stack_ffffffffffffffa0,
             (FormalArgumentSymbol **)in_stack_ffffffffffffff98);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::SVInt> *)0x701b5f);
  if (bVar1) {
    pFVar2 = this_00;
    std::optional<slang::SVInt>::operator*((optional<slang::SVInt> *)0x701b8a);
    expr = IntegerLiteral::fromConstant(in_RCX,(SVInt *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
    FormalArgumentSymbol::setDefaultValue(this_00,expr);
    this_00 = pFVar2;
  }
  return this_00;
}

Assistant:

FormalArgumentSymbol& MethodBuilder::addArg(std::string_view name, const Type& type,
                                            ArgumentDirection direction,
                                            std::optional<SVInt> defaultValue) {
    auto arg = compilation.emplace<FormalArgumentSymbol>(name, NL, direction,
                                                         VariableLifetime::Automatic);
    arg->setType(type);
    symbol.addMember(*arg);
    args.push_back(arg);

    if (defaultValue) {
        SLANG_ASSERT(type.isIntegral());
        arg->setDefaultValue(&IntegerLiteral::fromConstant(compilation, *defaultValue));
    }

    return *arg;
}